

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O0

void __thiscall MODEL3D::three_dim_model::calculate_all_layer_bounds(three_dim_model *this)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  pointer ppVar7;
  pointer pcVar8;
  reference piVar9;
  mapped_type *pmVar10;
  reference pvVar11;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  iterator n;
  iterator n_end;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  iterator k;
  iterator k_end;
  iterator j;
  iterator polygons_vector_end;
  iterator i;
  iterator layers_end;
  bool empty [4];
  three_dim_model *this_local;
  
  initialize_layer_boundary_map(this);
  bVar5 = true;
  bVar4 = true;
  bVar3 = true;
  bVar2 = true;
  i = std::
      map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
      ::end(&this->polygons_map);
  polygons_vector_end._M_current =
       (co_ord *)
       std::
       map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
       ::begin(&this->polygons_map);
  while (bVar6 = std::operator!=((_Self *)&polygons_vector_end,&i), bVar6) {
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                           *)&polygons_vector_end);
    j = std::vector<co_ord,_std::allocator<co_ord>_>::end(&ppVar7->second);
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                           *)&polygons_vector_end);
    k_end._M_current = (int *)std::vector<co_ord,_std::allocator<co_ord>_>::begin(&ppVar7->second);
    while (bVar6 = __gnu_cxx::operator!=
                             ((__normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_>
                               *)&k_end,&j), bVar6) {
      pcVar8 = __gnu_cxx::__normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_>
               ::operator->((__normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_>
                             *)&k_end);
      k = std::vector<int,_std::allocator<int>_>::end(&pcVar8->x);
      pcVar8 = __gnu_cxx::__normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_>
               ::operator->((__normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_>
                             *)&k_end);
      local_48._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&pcVar8->x);
      while (bVar6 = __gnu_cxx::operator!=(&local_48,&k), bVar6) {
        if (bVar2) {
          piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_48);
          iVar1 = *piVar9;
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                                 *)&polygons_vector_end);
          local_4c = ppVar7->first;
          pmVar10 = std::
                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[](&this->layer_boundary_map,(key_type *)&local_4c);
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](pmVar10,0);
          *pvVar11 = iVar1;
          bVar2 = false;
        }
        else {
          piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_48);
          iVar1 = *piVar9;
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                                 *)&polygons_vector_end);
          local_50 = ppVar7->first;
          pmVar10 = std::
                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[](&this->layer_boundary_map,(key_type *)&local_50);
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](pmVar10,0);
          if (iVar1 < *pvVar11) {
            piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_48);
            iVar1 = *piVar9;
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                     ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                                   *)&polygons_vector_end);
            local_54 = ppVar7->first;
            pmVar10 = std::
                      map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::operator[](&this->layer_boundary_map,(key_type *)&local_54);
            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](pmVar10,0);
            *pvVar11 = iVar1;
          }
        }
        if (bVar5) {
          piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_48);
          iVar1 = *piVar9;
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                                 *)&polygons_vector_end);
          local_58 = ppVar7->first;
          pmVar10 = std::
                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[](&this->layer_boundary_map,(key_type *)&local_58);
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](pmVar10,2);
          *pvVar11 = iVar1;
          bVar5 = false;
        }
        else {
          piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_48);
          iVar1 = *piVar9;
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                                 *)&polygons_vector_end);
          local_5c = ppVar7->first;
          pmVar10 = std::
                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[](&this->layer_boundary_map,(key_type *)&local_5c);
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](pmVar10,2);
          if (*pvVar11 < iVar1) {
            piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_48);
            iVar1 = *piVar9;
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                     ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                                   *)&polygons_vector_end);
            local_60 = ppVar7->first;
            pmVar10 = std::
                      map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::operator[](&this->layer_boundary_map,(key_type *)&local_60);
            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](pmVar10,2);
            *pvVar11 = iVar1;
          }
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_48,0);
      }
      pcVar8 = __gnu_cxx::__normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_>
               ::operator->((__normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_>
                             *)&k_end);
      n = std::vector<int,_std::allocator<int>_>::end(&pcVar8->y);
      pcVar8 = __gnu_cxx::__normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_>
               ::operator->((__normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_>
                             *)&k_end);
      local_78._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&pcVar8->y);
      while (bVar6 = __gnu_cxx::operator!=(&local_78,&n), bVar6) {
        if (bVar4) {
          piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_78);
          iVar1 = *piVar9;
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                                 *)&polygons_vector_end);
          local_7c = ppVar7->first;
          pmVar10 = std::
                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[](&this->layer_boundary_map,(key_type *)&local_7c);
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](pmVar10,1);
          *pvVar11 = iVar1;
          bVar4 = false;
        }
        else {
          piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_78);
          iVar1 = *piVar9;
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                                 *)&polygons_vector_end);
          local_80 = ppVar7->first;
          pmVar10 = std::
                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[](&this->layer_boundary_map,(key_type *)&local_80);
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](pmVar10,1);
          if (iVar1 < *pvVar11) {
            piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_78);
            iVar1 = *piVar9;
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                     ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                                   *)&polygons_vector_end);
            local_84 = ppVar7->first;
            pmVar10 = std::
                      map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::operator[](&this->layer_boundary_map,(key_type *)&local_84);
            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](pmVar10,1);
            *pvVar11 = iVar1;
          }
        }
        if (bVar3) {
          piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_78);
          iVar1 = *piVar9;
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                                 *)&polygons_vector_end);
          local_88 = ppVar7->first;
          pmVar10 = std::
                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[](&this->layer_boundary_map,(key_type *)&local_88);
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](pmVar10,3);
          *pvVar11 = iVar1;
          bVar3 = false;
        }
        else {
          piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_78);
          iVar1 = *piVar9;
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                                 *)&polygons_vector_end);
          local_8c = ppVar7->first;
          pmVar10 = std::
                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[](&this->layer_boundary_map,(key_type *)&local_8c);
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](pmVar10,3);
          if (*pvVar11 < iVar1) {
            piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_78);
            iVar1 = *piVar9;
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                     ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                                   *)&polygons_vector_end);
            local_90 = ppVar7->first;
            pmVar10 = std::
                      map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::operator[](&this->layer_boundary_map,(key_type *)&local_90);
            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](pmVar10,3);
            *pvVar11 = iVar1;
          }
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_78,0);
      }
      __gnu_cxx::__normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_>::
      operator++((__normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_> *)
                 &k_end,0);
    }
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                  *)&polygons_vector_end,0);
  }
  return;
}

Assistant:

void MODEL3D::three_dim_model::calculate_all_layer_bounds()
{
    initialize_layer_boundary_map();
    bool empty[4] = {true, true, true, true};
    //scan through each layer
    auto layers_end = polygons_map.end();
    for (auto i = polygons_map.begin(); i != layers_end; i++)
    {
        //scan through each polygon
        auto polygons_vector_end = i->second.end();
        for (auto j = i->second.begin(); j != polygons_vector_end; j++)
        {
            //scan through each x point
            auto k_end = j->x.end();
            for (auto k = j->x.begin(); k != k_end; k++)
            {
                //min  x check
                if (empty[0]==true)
                {
                    layer_boundary_map[i->first][0] = *k;
                    empty[0] = false;
                }
                else if(*k < layer_boundary_map[i->first][0])
                {
                    layer_boundary_map[i->first][0] = *k;
                }
                //max x check
                if (empty[2]==true)
                {
                    layer_boundary_map[i->first][2] = *k;
                    empty[2] = false;
                }
                else if(*k > layer_boundary_map[i->first][2])
                {
                    layer_boundary_map[i->first][2] = *k;
                }
            }
            //scan through each y point
            auto n_end = j->y.end();
            for (auto n = j->y.begin(); n != n_end; n++)
            {
                //min  y check
                if (empty[1]==true)
                {
                    layer_boundary_map[i->first][1] = *n;
                    empty[1] = false;
                }
                else if(*n < layer_boundary_map[i->first][1])
                {
                    layer_boundary_map[i->first][1] = *n;
                }
                //max y check
                if (empty[3]==true)
                {
                    layer_boundary_map[i->first][3] = *n;
                    empty[3] = false;
                }
                else if(*n > layer_boundary_map[i->first][3])
                {
                    layer_boundary_map[i->first][3] = *n;
                }
            }
        }
    }
}